

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O2

bool __thiscall kws::Generator::CreateFooter(Generator *this,ostream *file)

{
  ostream *poVar1;
  char *format;
  allocator local_61;
  string local_60;
  string local_40;
  
  std::operator<<(file,"<hr size=\"1\">");
  std::operator<<(file,"<table width=\"100%\" border=\"0\">");
  std::operator<<(file,"<tr>");
  poVar1 = std::operator<<(file,
                           "<td>Generated by <a href=\"https://public.kitware.com/KWStyle\">KWStyle</a> 1.0b on <i>"
                          );
  kwssys::SystemTools::GetCurrentDateTime_abi_cxx11_
            (&local_60,(SystemTools *)"%A %B,%d at %I:%M:%S%p",format);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  std::operator<<(poVar1,"</i></td>");
  std::__cxx11::string::~string((string *)&local_60);
  std::operator<<(file,"<td>");
  if ((this->m_KWStyleLogo)._M_string_length != 0) {
    poVar1 = std::operator<<(file,"<div align=\"center\"><img src=\"images/");
    std::__cxx11::string::string
              ((string *)&local_40,(this->m_KWStyleLogo)._M_dataplus._M_p,&local_61);
    kwssys::SystemTools::GetFilenameName(&local_60,&local_40);
    poVar1 = std::operator<<(poVar1,(string *)&local_60);
    poVar1 = std::operator<<(poVar1,"\" height=\"49\" /></div>");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<(file,"</td>");
  std::operator<<(file,"<td>");
  std::operator<<(file,
                  "<div align=\"right\"><a href=\"http://www.kitware.com\">&copy; Kitware Inc.</a></div></td>"
                 );
  std::operator<<(file,"</tr>");
  std::operator<<(file,"</table>");
  std::operator<<(file,"<br />");
  poVar1 = std::operator<<(file,"</html>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return true;
}

Assistant:

bool Generator::CreateFooter(std::ostream * file)
{
  *file << "<hr size=\"1\">";
  *file << R"(<table width="100%" border="0">)";
  *file << "<tr>";
  *file << "<td>Generated by <a href=\"https://public.kitware.com/KWStyle\">KWStyle</a> 1.0b on <i>" << kwssys::SystemTools::GetCurrentDateTime("%A %B,%d at %I:%M:%S%p") << "</i></td>";
  *file << "<td>";
  if (!m_KWStyleLogo.empty()) {
    *file << R"(<div align="center"><img src="images/)"
          << kwssys::SystemTools::GetFilenameName(m_KWStyleLogo.c_str())
          << R"(" height="49" /></div>)" << std::endl;
  }
  *file << "</td>";
  *file << "<td>";
  *file
      << R"(<div align="right"><a href="http://www.kitware.com">&copy; Kitware Inc.</a></div></td>)";
  *file << "</tr>";
  *file << "</table>";
  *file << "<br />";

  *file << "</html>" << std::endl;

  return true;
}